

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*params) [7])

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  char *__s1;
  undefined8 *in_R8;
  Maybe<unsigned_long> MVar5;
  Iterator iter;
  Iterator local_60;
  size_t local_48;
  char (*local_40) [7];
  SearchKey local_38;
  StringPtr *local_30;
  size_t *local_28;
  
  local_48 = table.size_;
  local_30 = table.ptr;
  local_28 = &local_48;
  local_38._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00237348;
  local_40 = params;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)&(local_30->content).size_,&local_38);
  uVar3 = (ulong)local_60.row;
  __n = extraout_RDX;
  if ((uVar3 != 0xe) && ((local_60.leaf)->rows[uVar3].i != 0)) {
    uVar3 = (ulong)((local_60.leaf)->rows[uVar3].i - 1);
    lVar4 = uVar3 * 0x20;
    lVar1 = *(long *)(local_48 + 8 + lVar4);
    __n.value = lVar1 + (ulong)(lVar1 == 0);
    if (__n.value == in_R8[1]) {
      if (lVar1 == 0) {
        __s1 = "";
      }
      else {
        __s1 = *(char **)(local_48 + lVar4);
      }
      iVar2 = bcmp(__s1,(void *)*in_R8,__n.value);
      __n = extraout_RDX_00;
      if (iVar2 == 0) {
        *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar3;
        goto LAB_00181f7f;
      }
    }
  }
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
LAB_00181f7f:
  MVar5.ptr.field_1.value = __n.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }